

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O0

bool __thiscall ftxui::anon_unknown_3::CheckboxBase::OnEvent(CheckboxBase *this,Event *event)

{
  bool bVar1;
  CheckboxOption *pCVar2;
  bool local_e9;
  Event local_b0;
  Event local_60;
  Event *local_20;
  Event *event_local;
  CheckboxBase *this_local;
  
  local_20 = event;
  event_local = (Event *)this;
  bVar1 = Event::is_mouse(event);
  if (bVar1) {
    Event::Event(&local_60,event);
    this_local._7_1_ = OnMouseEvent(this,&local_60);
    Event::~Event(&local_60);
  }
  else {
    Event::Character(&local_b0,' ');
    bVar1 = Event::operator==(event,&local_b0);
    local_e9 = true;
    if (!bVar1) {
      local_e9 = Event::operator==(event,(Event *)Event::Return);
    }
    Event::~Event(&local_b0);
    if (local_e9 == false) {
      this_local._7_1_ = 0;
    }
    else {
      *this->state_ = (bool)((*this->state_ ^ 0xffU) & 1);
      pCVar2 = Ref<ftxui::CheckboxOption>::operator->(&this->option_);
      std::function<void_()>::operator()(&pCVar2->on_change);
      this_local._7_1_ = 1;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OnEvent(Event event) override {
    if (event.is_mouse())
      return OnMouseEvent(event);

    if (event == Event::Character(' ') || event == Event::Return) {
      *state_ = !*state_;
      option_->on_change();
      return true;
    }
    return false;
  }